

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O1

void __thiscall
ExampleNLFeeder::
WriteSparseVec<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::SingleSparseVecWrtFactory<int,double>,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>
          (ExampleNLFeeder *this,SingleSparseVecWrtFactory<int,_double> *gw,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *vec)

{
  pointer ppVar1;
  pointer ppVar2;
  SparseVectorWriter<int,_double> gvw;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *local_28;
  char *local_20;
  
  mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::
  SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
            ((SingleSparseVecWrtFactory<int,_double> *)&stack0xffffffffffffffd8,(size_t)gw);
  ppVar1 = (vec->
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (vec->
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    local_20 = local_20 + -1;
    mp::BinaryFormatter::apr
              (&local_28->super_FormatterType,&local_28->nm,"%d %g\n",ppVar2->second,
               (ulong)(uint)ppVar2->first);
  }
  return;
}

Assistant:

void WriteSparseVec(GradWriterFactory& gw, const SparseVec& vec) {
    auto gvw = gw.MakeVectorWriter(vec.size());
    for (auto v: vec)
      gvw.Write(v.first, v.second);
  }